

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

void __thiscall CVmObjTads::invoke_finalizer(CVmObjTads *this,vm_obj_id_t self)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  long *in_FS_OFFSET;
  vm_obj_id_t srcobj;
  vm_val_t val;
  vm_val_t self_val;
  vm_val_t srcobj_val;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  vm_obj_id_t local_17c;
  uint local_178 [4];
  vm_val_t local_168;
  vm_val_t local_158;
  uint local_148 [2];
  long local_140;
  void *local_138;
  __jmp_buf_tag local_130;
  vm_rcdesc local_68;
  
  if ((((G_predef_X.obj_destruct != 0) &&
       (iVar3 = (*(this->super_CVmObject)._vptr_CVmObject[0xd])
                          (this,(ulong)G_predef_X.obj_destruct,local_178,self,&local_17c,0),
       iVar3 != 0)) && (local_178[0] < 0x13)) && ((0x64800U >> (local_178[0] & 0x1f) & 1) != 0)) {
    G_err_frame::__tls_init();
    local_140 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_148;
    local_148[0] = _setjmp(&local_130);
    if (local_148[0] == 0) {
      local_158.typ = VM_OBJ;
      local_158.val.obj = local_17c;
      local_168.typ = VM_OBJ;
      local_68.name = "TadsObject.finalize";
      local_68.bifptr.typ = VM_NIL;
      local_68.self.typ = VM_NIL;
      local_68.method_idx = 0;
      local_68.argc = 0;
      local_68.argp = (vm_val_t *)0x0;
      local_68.caller_addr = (uchar *)0x0;
      local_168.val.obj = self;
      CVmRun::get_prop(&G_interpreter_X,0,&local_158,G_predef_X.obj_destruct,&local_168,0,&local_68)
      ;
    }
    lVar1 = local_140;
    if (local_148[0] == 1) {
      local_148[0] = 2;
    }
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_148[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_138;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_148[0] & 2) != 0) {
      free(local_138);
    }
  }
  return;
}

Assistant:

void CVmObjTads::invoke_finalizer(VMG_ vm_obj_id_t self)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* 
     *   look up the finalization method - if it's defined, and it's a
     *   method, invoke it; otherwise do nothing 
     */
    if (G_predef->obj_destruct != VM_INVALID_PROP
        && get_prop(vmg_ G_predef->obj_destruct, &val, self, &srcobj, 0)
        && (val.typ == VM_CODEOFS
            || val.typ == VM_NATIVE_CODE
            || val.typ == VM_OBJX
            || val.typ == VM_BIFPTRX))
    {
        /* 
         *   invoke the finalizer in a protected frame, to ensure that we
         *   catch any exceptions that are thrown out of the finalizer 
         */
        err_try
        {
            vm_val_t srcobj_val;
            vm_val_t self_val;

            /* 
             *   Invoke the finalizer.  Use a recursive VM invocation,
             *   since the VM must return to the garbage collector, not to
             *   what it was doing in the enclosing stack frame. 
             */
            srcobj_val.set_obj(srcobj);
            self_val.set_obj(self);
            vm_rcdesc rc("TadsObject.finalize");
            G_interpreter->get_prop(vmg_ 0, &srcobj_val,
                                    G_predef->obj_destruct, &self_val, 0, &rc);
        }
        err_catch_disc
        {
            /* silently ignore the error */
        }
        err_end;
    }